

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD1DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  DecodeStatus DVar8;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint size;
  uint align;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,4,1);
  uVar5 = fieldFromInstruction_4(in_ESI,6,2);
  if ((uVar5 == 0) && (uVar3 == 1)) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar6 = uVar3 * (1 << ((byte)uVar5 & 0x1f));
    uVar7 = MCInst_getOpcode(in_RDI);
    if (uVar7 - 0x350 < 9) {
      DVar8 = DecodeDPairRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,uVar6),(void *)CONCAT44(uVar5,uVar4));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar8);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    else {
      DVar8 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,uVar6),(void *)CONCAT44(uVar5,uVar4));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar8);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    if (uVar2 != 0xf) {
      DVar8 = DecodeGPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,uVar6),(void *)CONCAT44(uVar5,uVar4));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar8);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar8 = DecodeGPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,uVar6),(void *)CONCAT44(uVar5,uVar4));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar8);
    if (_Var1) {
      MCOperand_CreateImm0(in_RDI,(ulong)uVar6);
      if ((uVar2 != 0xd) && (uVar2 != 0xf)) {
        DVar8 = DecodeGPRRegisterClass
                          (in_RCX,local_4,CONCAT44(uVar2,uVar6),(void *)CONCAT44(uVar5,uVar4));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar8);
        if (!_Var1) {
          local_4 = MCDisassembler_Fail;
        }
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLD1DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = fieldFromInstruction_4(Insn, 6, 2);

	if (size == 0 && align == 1)
		return MCDisassembler_Fail;
	align *= (1 << size);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1DUPq16: case ARM_VLD1DUPq32: case ARM_VLD1DUPq8:
		case ARM_VLD1DUPq16wb_fixed: case ARM_VLD1DUPq16wb_register:
		case ARM_VLD1DUPq32wb_fixed: case ARM_VLD1DUPq32wb_register:
		case ARM_VLD1DUPq8wb_fixed: case ARM_VLD1DUPq8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
	// variant encodes Rm == 0xf. Anything else is a register offset post-
	// increment and we need to add the register operand to the instruction.
	if (Rm != 0xD && Rm != 0xF &&
			!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}